

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O3

void embree::sse2::splitPrimitive<embree::sse2::TriangleSplitter>
               (TriangleSplitter *splitter,PrimRef *prim,uint splitprims,SplittingGrid *grid,
               PrimRef *subPrims,uint *numSubPrims)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  ulong uVar12;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uint uVar19;
  uint uVar20;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  undefined1 auVar21 [16];
  float fVar26;
  float fVar27;
  float __x;
  float __x_00;
  float __x_01;
  float fVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  PrimRef left;
  PrimRef right;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_a0;
  undefined1 local_90 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_80;
  undefined1 local_70 [16];
  
  if (splitprims == 1) {
    uVar19 = *numSubPrims;
    *numSubPrims = uVar19 + 1;
    uVar9 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
    *(undefined8 *)&subPrims[uVar19].lower.field_0 = *(undefined8 *)&(prim->lower).field_0;
    *(undefined8 *)((long)&subPrims[uVar19].lower.field_0 + 8) = uVar9;
    uVar9 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
    *(undefined8 *)&subPrims[uVar19].upper.field_0 = *(undefined8 *)&(prim->upper).field_0;
    *(undefined8 *)((long)&subPrims[uVar19].upper.field_0 + 8) = uVar9;
  }
  else {
    aVar10 = (prim->lower).field_0;
    fVar17 = (grid->base).field_0.m128[0];
    fVar18 = (grid->base).field_0.m128[1];
    fVar29 = (grid->base).field_0.m128[2];
    fVar16 = grid->scale;
    fVar26 = ((prim->lower).field_0.m128[0] - fVar17) * fVar16 + 0.2;
    __x = ((prim->lower).field_0.m128[1] - fVar18) * fVar16 + 0.2;
    __x_01 = ((prim->lower).field_0.m128[2] - fVar29) * fVar16 + 0.2;
    aVar11 = (prim->upper).field_0;
    fVar27 = ((prim->upper).field_0.m128[0] - fVar17) * fVar16 + -0.2;
    __x_00 = ((prim->upper).field_0.m128[1] - fVar18) * fVar16 + -0.2;
    fVar29 = ((prim->upper).field_0.m128[2] - fVar29) * fVar16 + -0.2;
    fVar16 = floorf(__x_01);
    fVar17 = floorf(fVar26);
    fVar18 = floorf(__x);
    uVar19 = (uint)fVar17;
    uVar22 = (uint)fVar18;
    uVar24 = (uint)fVar16;
    fVar16 = floorf(fVar29);
    fVar17 = floorf(fVar27);
    fVar18 = floorf(__x_00);
    uVar20 = -(uint)((int)fVar26 < (int)fVar27);
    uVar23 = -(uint)((int)__x < (int)__x_00);
    uVar25 = -(uint)((int)__x_01 < (int)fVar29);
    local_a0.m128[0] = (float)(~uVar20 & uVar19 | (int)fVar17 & uVar20);
    local_a0.m128[1] = (float)(~uVar23 & uVar22 | (int)fVar18 & uVar23);
    local_a0.m128[2] = (float)(~uVar25 & uVar24 | (int)fVar16 & uVar25);
    local_a0.m128[3] = 0.0;
    uVar19 = (uVar19 << 0x10 | uVar19) & 0x30000ff;
    uVar19 = (uVar19 << 8 | uVar19) & 0x300f00f;
    uVar20 = (uVar22 << 0x10 | uVar22) & 0x30000ff;
    uVar22 = (uVar20 << 8 | uVar20) & 0x300f00f;
    uVar20 = (uVar24 << 0x10 | uVar24) & 0x30000ff;
    uVar20 = (uVar20 << 8 | uVar20) & 0x300f00f;
    uVar20 = ((uVar20 << 4 | uVar20) & 0x30c30c3) * 0x14 & 0x24924924 |
             ((uVar22 << 4 | uVar22) & 0x30c30c3) * 10 & 0x12492492 |
             ((uVar19 << 4 | uVar19) & 0x30c30c3) * 5 & 0x9249249;
    uVar19 = ((int)local_a0.m128[0] << 0x10 | (uint)local_a0.m128[0]) & 0x30000ff;
    uVar23 = (uVar19 << 8 | uVar19) & 0x300f00f;
    uVar19 = ((int)local_a0.m128[1] << 0x10 | (uint)local_a0.m128[1]) & 0x30000ff;
    uVar22 = (uVar19 << 8 | uVar19) & 0x300f00f;
    uVar19 = ((int)local_a0.m128[2] << 0x10 | (uint)local_a0.m128[2]) & 0x30000ff;
    uVar19 = (uVar19 << 8 | uVar19) & 0x300f00f;
    uVar19 = ((uVar19 << 4 | uVar19) & 0x30c30c3) * 0x14 & 0x24924924 |
             ((uVar22 << 4 | uVar22) & 0x30c30c3) * 10 & 0x12492492 |
             ((uVar23 << 4 | uVar23) & 0x30c30c3) * 5 & 0x9249249;
    if (uVar20 == uVar19) {
      uVar19 = *numSubPrims;
      *numSubPrims = uVar19 + 1;
      uVar9 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
      *(undefined8 *)&subPrims[uVar19].lower.field_0 = *(undefined8 *)&(prim->lower).field_0;
      *(undefined8 *)((long)&subPrims[uVar19].lower.field_0 + 8) = uVar9;
      uVar9 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
      *(undefined8 *)&subPrims[uVar19].upper.field_0 = *(undefined8 *)&(prim->upper).field_0;
      *(undefined8 *)((long)&subPrims[uVar19].upper.field_0 + 8) = uVar9;
    }
    else {
      uVar19 = uVar19 ^ uVar20;
      uVar20 = 0x1f;
      if (uVar19 != 0) {
        for (; uVar19 >> uVar20 == 0; uVar20 = uVar20 - 1) {
        }
      }
      uVar15 = (ulong)uVar20;
      uVar12 = (ulong)(uVar20 % 3 << 2);
      bVar13 = (byte)(uVar15 / 3);
      fVar17 = (float)((*(uint *)((long)&local_a0 + uVar12) >> (bVar13 & 0x1f)) << (bVar13 & 0x1f))
               * 0.0009765625 * grid->extend + *(float *)((long)&(grid->base).field_0 + uVar12);
      lVar14 = 0;
      auVar21 = _DAT_01f7aa00;
      auVar28 = _DAT_01f7a9f0;
      auVar30 = _DAT_01f7aa00;
      auVar31 = _DAT_01f7a9f0;
      fVar16 = *(float *)((long)&splitter->v[0].field_0 + uVar12);
      do {
        if (fVar16 <= fVar17) {
          auVar5 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar14);
          auVar31 = minps(auVar31,auVar5);
          auVar30 = maxps(auVar30,auVar5);
        }
        if (fVar17 <= fVar16) {
          auVar5 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar14);
          auVar28 = minps(auVar28,auVar5);
          auVar21 = maxps(auVar21,auVar5);
        }
        fVar18 = *(float *)((long)splitter + lVar14 + uVar15 * 4 + (uVar15 / 3) * -0xc + 0x10);
        if (((fVar16 < fVar17) && (fVar17 < fVar18)) || ((fVar17 < fVar16 && (fVar18 < fVar17)))) {
          fVar16 = (fVar17 - fVar16) * (1.0 / (fVar18 - fVar16));
          pfVar2 = (float *)((long)&splitter->v[0].field_0 + lVar14);
          pfVar1 = (float *)((long)&splitter->v[1].field_0 + lVar14);
          fVar29 = (*pfVar1 - *pfVar2) * fVar16 + *pfVar2;
          fVar26 = (pfVar1[1] - pfVar2[1]) * fVar16 + pfVar2[1];
          fVar27 = (pfVar1[2] - pfVar2[2]) * fVar16 + pfVar2[2];
          fVar16 = (pfVar1[3] - pfVar2[3]) * fVar16 + pfVar2[3];
          auVar5._4_4_ = fVar26;
          auVar5._0_4_ = fVar29;
          auVar5._8_4_ = fVar27;
          auVar5._12_4_ = fVar16;
          auVar31 = minps(auVar31,auVar5);
          auVar6._4_4_ = fVar26;
          auVar6._0_4_ = fVar29;
          auVar6._8_4_ = fVar27;
          auVar6._12_4_ = fVar16;
          auVar30 = maxps(auVar30,auVar6);
          auVar7._4_4_ = fVar26;
          auVar7._0_4_ = fVar29;
          auVar7._8_4_ = fVar27;
          auVar7._12_4_ = fVar16;
          auVar28 = minps(auVar28,auVar7);
          auVar8._4_4_ = fVar26;
          auVar8._0_4_ = fVar29;
          auVar8._8_4_ = fVar27;
          auVar8._12_4_ = fVar16;
          auVar21 = maxps(auVar21,auVar8);
        }
        lVar14 = lVar14 + 0x10;
        fVar16 = fVar18;
      } while (lVar14 != 0x30);
      auVar31 = maxps(auVar31,(undefined1  [16])aVar10);
      auVar30 = minps(auVar30,(undefined1  [16])aVar11);
      uVar3 = *(undefined4 *)((long)&(prim->lower).field_0 + 0xc);
      uVar4 = *(undefined4 *)((long)&(prim->upper).field_0 + 0xc);
      local_a0._0_12_ = auVar31._0_12_;
      local_a0.m128[3] = (float)uVar3;
      local_90._0_12_ = auVar30._0_12_;
      local_90._12_4_ = uVar4;
      auVar28 = maxps(auVar28,(undefined1  [16])aVar10);
      auVar21 = minps(auVar21,(undefined1  [16])aVar11);
      local_80._0_12_ = auVar28._0_12_;
      local_80.m128[3] = (float)uVar3;
      local_70._0_12_ = auVar21._0_12_;
      local_70._12_4_ = uVar4;
      splitPrimitive<embree::sse2::TriangleSplitter>
                (splitter,(PrimRef *)&local_a0.field_1,splitprims >> 1,grid,subPrims,numSubPrims);
      splitPrimitive<embree::sse2::TriangleSplitter>
                (splitter,(PrimRef *)&local_80.field_1,splitprims - (splitprims >> 1),grid,subPrims,
                 numSubPrims);
    }
  }
  return;
}

Assistant:

void splitPrimitive(const Splitter& splitter,
                          const PrimRef& prim,
                          const unsigned int splitprims,
                          const SplittingGrid& grid,
                          PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                          unsigned int& numSubPrims)
    {
      assert(splitprims > 0 && splitprims <= MAX_PRESPLITS_PER_PRIMITIVE);
      
      if (splitprims == 1)
      {
        assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
        subPrims[numSubPrims++] = prim;
      }
      else
      {
        unsigned int dim; float fsplit;
        if (!grid.split_pos(prim, dim, fsplit))
        {
          assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
          subPrims[numSubPrims++] = prim;
          return;
        }
          
        /* split primitive */
        PrimRef left,right;
        splitter(prim,dim,fsplit,left,right);
        assert(!left.bounds().empty());
        assert(!right.bounds().empty());

        const unsigned int splitprims_left = splitprims/2;
        const unsigned int splitprims_right = splitprims - splitprims_left;
        splitPrimitive(splitter,left,splitprims_left,grid,subPrims,numSubPrims);
        splitPrimitive(splitter,right,splitprims_right,grid,subPrims,numSubPrims);
      }
    }